

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFormatUtil.hpp
# Opt level: O1

ostream * tcu::Format::operator<<(ostream *str,Array<const_float_*> *fmt)

{
  float *pfVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(str,"{ ",2);
  pfVar1 = fmt->begin;
  if (pfVar1 != fmt->end) {
    do {
      if (pfVar1 != fmt->begin) {
        std::__ostream_insert<char,std::char_traits<char>>(str,", ",2);
      }
      std::ostream::_M_insert<double>((double)*pfVar1);
      pfVar1 = pfVar1 + 1;
    } while (pfVar1 != fmt->end);
  }
  std::__ostream_insert<char,std::char_traits<char>>(str," }",2);
  return str;
}

Assistant:

std::ostream& operator<< (std::ostream& str, const Array<Iterator>& fmt)
{
	str << "{ ";
	for (Iterator cur = fmt.begin; cur != fmt.end; ++cur)
	{
		if (cur != fmt.begin)
			str << ", ";
		str << *cur;
	}
	str << " }";
	return str;
}